

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution_packed.h
# Opt level: O3

void ncnn::convolution_transform_kernel_packed
               (Mat *kernel,Mat *kernel_tm,int inch,int outch,int kernel_w,int kernel_h)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  bool bVar8;
  int iVar9;
  void *pvVar10;
  bool bVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  int iVar15;
  long lVar16;
  float *k0_2;
  void *pvVar17;
  long lVar18;
  int iVar19;
  void *pvVar20;
  int iVar21;
  uint uVar22;
  uint uVar23;
  long lVar24;
  void *pvVar25;
  int iVar26;
  void *pvVar27;
  ulong uVar28;
  ulong uVar29;
  int iVar30;
  int iVar31;
  int iVar32;
  void *pvVar33;
  void *pvVar34;
  int k;
  void *pvVar35;
  void *pvVar36;
  undefined1 (*pauVar37) [64];
  long lVar38;
  void *pvVar39;
  long lVar40;
  void *pvVar41;
  long lVar42;
  uint uVar43;
  undefined1 (*pauVar45) [64];
  void *pvVar46;
  undefined1 auVar47 [16];
  undefined1 auVar48 [32];
  undefined1 auVar49 [64];
  undefined1 auVar50 [64];
  undefined1 auVar51 [64];
  undefined1 auVar52 [64];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 auVar55 [64];
  undefined1 auVar56 [64];
  undefined1 auVar57 [64];
  undefined1 auVar58 [64];
  undefined1 auVar59 [64];
  undefined1 auVar60 [64];
  undefined1 auVar61 [64];
  undefined1 auVar62 [64];
  undefined1 auVar63 [64];
  undefined1 auVar64 [64];
  undefined1 auVar65 [64];
  undefined1 auVar66 [64];
  undefined1 auVar67 [64];
  undefined1 auVar68 [64];
  undefined1 auVar69 [64];
  undefined1 auVar70 [64];
  undefined1 auVar71 [64];
  undefined1 auVar72 [64];
  undefined1 in_ZMM3 [64];
  undefined1 auVar73 [32];
  undefined1 in_ZMM4 [64];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 in_ZMM16 [64];
  undefined1 in_ZMM17 [64];
  int local_144;
  void *local_130;
  void *local_128;
  void *local_108;
  void *local_f8;
  int local_d4;
  int local_d0;
  int local_cc;
  int local_c8;
  int local_c4;
  int local_c0;
  int local_bc;
  int local_b8;
  int local_b4;
  int local_b0;
  int local_ac;
  ulong uVar44;
  
  uVar43 = kernel_w * kernel_h;
  uVar44 = (ulong)uVar43;
  if (outch < 0x10) {
    iVar15 = inch;
    if (outch < 8) {
      if (outch < 4) {
        if (outch < 2) {
          iVar21 = outch;
          if (inch < 0x10) {
            if (inch < 8) {
              if (inch < 4) {
                uVar22 = uVar43;
                if (1 < inch) {
                  uVar22 = uVar43 * 2;
                  iVar15 = (inch & 1U) + 1;
                }
              }
              else {
                uVar22 = uVar43 * 4;
                iVar15 = (inch & 1U) + 1 + (uint)(((uint)inch >> 1 & 1) != 0);
              }
            }
            else {
              uVar22 = uVar43 * 8;
              iVar15 = (inch & 1U) + 1 + ((uint)inch >> 2 & 1) + (uint)(((uint)inch >> 1 & 1) != 0);
            }
          }
          else {
            uVar22 = uVar43 * 0x10;
            iVar15 = (inch & 1U) + ((uint)inch >> 4) + (uint)(((uint)inch >> 3 & 1) != 0) +
                     ((uint)inch >> 2 & 1) + (uint)(((uint)inch >> 1 & 1) != 0);
          }
        }
        else {
          if (inch < 0x10) {
            if (inch < 8) {
              if (inch < 4) {
                if (inch < 2) {
                  uVar22 = uVar43 * 2;
                  iVar21 = (outch & 1U) + 1;
                  goto LAB_00182bf8;
                }
                uVar22 = uVar43 * 4;
                iVar15 = (inch & 1U) + 1;
              }
              else {
                iVar15 = (inch & 1U) + 1 + (uint)(((uint)inch >> 1 & 1) != 0);
                uVar22 = uVar43 * 8;
              }
            }
            else {
              uVar22 = uVar43 * 0x10;
              iVar15 = (inch & 1U) + 1 + ((uint)inch >> 2 & 1) + (uint)(((uint)inch >> 1 & 1) != 0);
            }
          }
          else {
            uVar22 = uVar43 * 0x20;
            iVar15 = (inch & 1U) + ((uint)inch >> 4) + (uint)(((uint)inch >> 3 & 1) != 0) +
                     ((uint)inch >> 2 & 1) + (uint)(((uint)inch >> 1 & 1) != 0);
          }
          iVar21 = (outch & 1U) + 1;
        }
      }
      else {
        if (inch < 0x10) {
          if (inch < 8) {
            if (inch < 4) {
              if (inch < 2) {
                uVar22 = uVar43 * 4;
                iVar21 = (outch & 1U) + 1 + (uint)(((uint)outch >> 1 & 1) != 0);
                goto LAB_00182bf8;
              }
              uVar22 = uVar43 * 8;
              iVar15 = (inch & 1U) + 1;
            }
            else {
              uVar22 = uVar43 * 0x10;
              iVar15 = (inch & 1U) + 1 + (uint)(((uint)inch >> 1 & 1) != 0);
            }
          }
          else {
            uVar22 = uVar43 * 0x20;
            iVar15 = (inch & 1U) + 1 + ((uint)inch >> 2 & 1) + (uint)(((uint)inch >> 1 & 1) != 0);
          }
        }
        else {
          uVar22 = uVar43 * 0x40;
          iVar15 = (inch & 1U) + ((uint)inch >> 4) + (uint)(((uint)inch >> 3 & 1) != 0) +
                   ((uint)inch >> 2 & 1) + (uint)(((uint)inch >> 1 & 1) != 0);
        }
        iVar21 = (outch & 1U) + 1 + (uint)(((uint)outch >> 1 & 1) != 0);
      }
    }
    else {
      if (inch < 0x10) {
        if (inch < 8) {
          if (inch < 4) {
            if (inch < 2) {
              uVar22 = uVar43 * 8;
              iVar21 = (outch & 1U) + 1 + ((uint)outch >> 2 & 1) +
                       (uint)(((uint)outch >> 1 & 1) != 0);
              goto LAB_00182bf8;
            }
            uVar22 = uVar43 * 0x10;
            iVar15 = (inch & 1U) + 1;
          }
          else {
            uVar22 = uVar43 * 0x20;
            iVar15 = (inch & 1U) + 1 + (uint)(((uint)inch >> 1 & 1) != 0);
          }
        }
        else {
          uVar22 = uVar43 * 0x40;
          iVar15 = (inch & 1U) + 1 + ((uint)inch >> 2 & 1) + (uint)(((uint)inch >> 1 & 1) != 0);
        }
      }
      else {
        uVar22 = uVar43 * 0x80;
        iVar15 = (inch & 1U) + ((uint)inch >> 4) + (uint)(((uint)inch >> 3 & 1) != 0) +
                 ((uint)inch >> 2 & 1) + (uint)(((uint)inch >> 1 & 1) != 0);
      }
      iVar21 = (outch & 1U) + 1 + ((uint)outch >> 2 & 1) + (uint)(((uint)outch >> 1 & 1) != 0);
    }
LAB_00182bf8:
    uVar14 = 0;
    Mat::create(kernel_tm,uVar22,iVar15,iVar21,4,(Allocator *)0x0);
    goto LAB_00182c00;
  }
  if (inch < 0x10) {
    if (7 < inch) {
      iVar21 = uVar43 * 0x80;
      iVar15 = (inch & 1U) + 1 + ((uint)inch >> 2 & 1) + (uint)(((uint)inch >> 1 & 1) != 0);
      goto LAB_00181f80;
    }
    if (3 < inch) {
      iVar21 = uVar43 * 0x40;
      iVar15 = (inch & 1U) + 1 + (uint)(((uint)inch >> 1 & 1) != 0);
      goto LAB_00181f80;
    }
    if (1 < inch) {
      iVar21 = uVar43 * 0x20;
      iVar15 = (inch & 1U) + 1;
      goto LAB_00181f80;
    }
    iVar21 = uVar43 * 0x10;
    iVar12 = (outch & 1U) + ((uint)outch >> 4) + (uint)(((uint)outch >> 3 & 1) != 0) +
             ((uint)outch >> 2 & 1) + (uint)(((uint)outch >> 1 & 1) != 0);
    iVar15 = inch;
  }
  else {
    iVar21 = uVar43 * 0x100;
    iVar15 = (inch & 1U) + ((uint)inch >> 4) + (uint)(((uint)inch >> 3 & 1) != 0) +
             ((uint)inch >> 2 & 1) + (uint)(((uint)inch >> 1 & 1) != 0);
LAB_00181f80:
    iVar12 = (outch & 1U) + ((uint)outch >> 4) + (uint)(((uint)outch >> 3 & 1) != 0) +
             ((uint)outch >> 2 & 1) + (uint)(((uint)outch >> 1 & 1) != 0);
  }
  Mat::create(kernel_tm,iVar21,iVar15,iVar12,4,(Allocator *)0x0);
  auVar49 = vpbroadcastd_avx512f();
  auVar49 = vpmulld_avx512f(auVar49,_DAT_005a6a80);
  iVar13 = uVar43 * inch;
  auVar50 = vpbroadcastd_avx512f();
  vpmulld_avx512f(auVar49,auVar50);
  iVar15 = iVar13 * 5;
  iVar30 = iVar13 * 0x10;
  lVar24 = (long)(int)(uVar43 * 0x10) * 4;
  iVar12 = iVar13 * 2;
  local_ac = iVar13 * 0xe;
  local_b0 = iVar13 * 8;
  local_b4 = iVar13 * 7;
  lVar16 = (long)(int)uVar43 * 4;
  lVar38 = (long)(int)(uVar43 * 2) * 4;
  local_b8 = iVar13 * 0xf;
  iVar21 = iVar13 * 3;
  local_bc = iVar13 * 0xd;
  iVar31 = iVar13 * 4;
  local_c0 = iVar13 * 0xc;
  local_c4 = iVar13 * 0xb;
  local_c8 = iVar13 * 10;
  local_cc = iVar13 * 9;
  local_d0 = iVar13 * 6;
  iVar9 = 0;
  uVar29 = 0;
  local_d4 = iVar13;
  do {
    pauVar45 = (undefined1 (*) [64])
               ((uVar29 >> 4) * kernel_tm->cstep * kernel_tm->elemsize + (long)kernel_tm->data);
    pvVar10 = kernel->data;
    if (inch < 0x10) {
      pvVar10 = (void *)((long)pvVar10 + (long)(iVar13 * (int)uVar29) * 4);
      uVar14 = 0;
    }
    else {
      pvVar25 = (void *)((long)local_b8 * 4 + (long)pvVar10);
      local_f8 = (void *)((long)local_ac * 4 + (long)pvVar10);
      pvVar33 = (void *)((long)local_bc * 4 + (long)pvVar10);
      pvVar27 = (void *)((long)local_c0 * 4 + (long)pvVar10);
      pvVar41 = (void *)((long)local_c4 * 4 + (long)pvVar10);
      pvVar17 = (void *)((long)local_c8 * 4 + (long)pvVar10);
      pvVar36 = (void *)((long)local_cc * 4 + (long)pvVar10);
      pvVar39 = (void *)((long)local_b0 * 4 + (long)pvVar10);
      pvVar46 = (void *)((long)local_b4 * 4 + (long)pvVar10);
      pvVar20 = (void *)((long)local_d0 * 4 + (long)pvVar10);
      local_128 = (void *)((long)iVar15 * 4 + (long)pvVar10);
      local_108 = (void *)((long)iVar31 * 4 + (long)pvVar10);
      local_130 = (void *)((long)iVar21 * 4 + (long)pvVar10);
      pvVar35 = (void *)((long)iVar12 * 4 + (long)pvVar10);
      pvVar34 = (void *)((long)local_d4 * 4 + (long)pvVar10);
      pvVar10 = (void *)((long)iVar9 * 4 + (long)pvVar10);
      iVar32 = 0;
      do {
        if (0 < (int)uVar43) {
          lVar42 = 0;
          do {
            auVar49 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar10 * 5 + lVar42));
            auVar50 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar34 + (long)pvVar10 * 4 + lVar42)
                                        );
            auVar51 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar35 + (long)pvVar10 * 4 + lVar42)
                                        );
            auVar52 = vgatherdps_avx512f(*(undefined4 *)
                                          ((long)local_130 + (long)pvVar10 * 4 + lVar42));
            auVar53 = vgatherdps_avx512f(*(undefined4 *)
                                          ((long)local_108 + (long)pvVar10 * 4 + lVar42));
            auVar54 = vgatherdps_avx512f(*(undefined4 *)
                                          ((long)local_128 + (long)pvVar10 * 4 + lVar42));
            auVar55 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar20 + (long)pvVar10 * 4 + lVar42)
                                        );
            auVar56 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar46 + (long)pvVar10 * 4 + lVar42)
                                        );
            auVar57 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar39 + (long)pvVar10 * 4 + lVar42)
                                        );
            auVar58 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar36 + (long)pvVar10 * 4 + lVar42)
                                        );
            auVar59 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar17 + (long)pvVar10 * 4 + lVar42)
                                        );
            auVar60 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar41 + (long)pvVar10 * 4 + lVar42)
                                        );
            auVar61 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar27 + (long)pvVar10 * 4 + lVar42)
                                        );
            auVar62 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar33 + (long)pvVar10 * 4 + lVar42)
                                        );
            vxorps_avx512vl(in_ZMM16._0_16_,in_ZMM16._0_16_);
            auVar63 = vgatherdps_avx512f(*(undefined4 *)
                                          ((long)local_f8 + (long)pvVar10 * 4 + lVar42));
            vxorps_avx512vl(in_ZMM17._0_16_,in_ZMM17._0_16_);
            auVar64 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar25 + (long)pvVar10 * 4 + lVar42)
                                        );
            auVar65 = vunpcklps_avx512f(auVar49,auVar50);
            auVar49 = vunpckhps_avx512f(auVar49,auVar50);
            auVar50 = vunpcklps_avx512f(auVar51,auVar52);
            auVar51 = vunpckhps_avx512f(auVar51,auVar52);
            auVar52 = vunpcklps_avx512f(auVar53,auVar54);
            auVar53 = vunpckhps_avx512f(auVar53,auVar54);
            auVar54 = vunpcklps_avx512f(auVar55,auVar56);
            auVar55 = vunpckhps_avx512f(auVar55,auVar56);
            auVar56 = vunpcklps_avx512f(auVar57,auVar58);
            auVar57 = vunpckhps_avx512f(auVar57,auVar58);
            auVar58 = vunpcklps_avx512f(auVar59,auVar60);
            auVar59 = vunpckhps_avx512f(auVar59,auVar60);
            auVar60 = vunpcklps_avx512f(auVar61,auVar62);
            auVar61 = vunpckhps_avx512f(auVar61,auVar62);
            auVar62 = vunpcklps_avx512f(auVar63,auVar64);
            auVar63 = vunpckhps_avx512f(auVar63,auVar64);
            auVar64 = vunpcklpd_avx512f(auVar65,auVar50);
            auVar50 = vunpckhpd_avx512f(auVar65,auVar50);
            auVar65 = vunpcklpd_avx512f(auVar49,auVar51);
            auVar49 = vunpckhpd_avx512f(auVar49,auVar51);
            auVar51 = vunpcklpd_avx512f(auVar52,auVar54);
            auVar52 = vunpckhpd_avx512f(auVar52,auVar54);
            auVar54 = vunpcklpd_avx512f(auVar53,auVar55);
            auVar53 = vunpckhpd_avx512f(auVar53,auVar55);
            auVar55 = vunpcklpd_avx512f(auVar56,auVar58);
            auVar56 = vunpckhpd_avx512f(auVar56,auVar58);
            auVar58 = vunpcklpd_avx512f(auVar57,auVar59);
            auVar57 = vunpckhpd_avx512f(auVar57,auVar59);
            auVar59 = vunpcklpd_avx512f(auVar60,auVar62);
            auVar60 = vunpckhpd_avx512f(auVar60,auVar62);
            auVar62 = vunpcklpd_avx512f(auVar61,auVar63);
            auVar61 = vunpckhpd_avx512f(auVar61,auVar63);
            auVar63 = vshuff64x2_avx512f(auVar64,auVar51,0x88);
            auVar66 = vshuff64x2_avx512f(auVar55,auVar59,0x88);
            auVar67 = vshuff64x2_avx512f(auVar50,auVar52,0x88);
            auVar68 = vshuff64x2_avx512f(auVar56,auVar60,0x88);
            auVar69 = vshuff64x2_avx512f(auVar65,auVar54,0x88);
            auVar70 = vshuff64x2_avx512f(auVar58,auVar62,0x88);
            auVar71 = vshuff64x2_avx512f(auVar49,auVar53,0x88);
            auVar72 = vshuff64x2_avx512f(auVar57,auVar61,0x88);
            auVar51 = vshuff64x2_avx512f(auVar64,auVar51,0xdd);
            auVar55 = vshuff64x2_avx512f(auVar55,auVar59,0xdd);
            auVar50 = vshuff64x2_avx512f(auVar50,auVar52,0xdd);
            auVar52 = vshuff64x2_avx512f(auVar56,auVar60,0xdd);
            auVar54 = vshuff64x2_avx512f(auVar65,auVar54,0xdd);
            auVar56 = vshuff64x2_avx512f(auVar58,auVar62,0xdd);
            auVar49 = vshuff64x2_avx512f(auVar49,auVar53,0xdd);
            auVar53 = vshuff64x2_avx512f(auVar57,auVar61,0xdd);
            auVar57 = vshuff64x2_avx512f(auVar63,auVar66,0x88);
            auVar58 = vshuff64x2_avx512f(auVar67,auVar68,0x88);
            auVar59 = vshuff64x2_avx512f(auVar69,auVar70,0x88);
            auVar60 = vshuff64x2_avx512f(auVar71,auVar72,0x88);
            auVar61 = vshuff64x2_avx512f(auVar51,auVar55,0x88);
            auVar62 = vshuff64x2_avx512f(auVar50,auVar52,0x88);
            in_ZMM17 = vshuff64x2_avx512f(auVar54,auVar56,0x88);
            auVar64 = vshuff64x2_avx512f(auVar49,auVar53,0x88);
            in_ZMM16 = vshuff64x2_avx512f(auVar63,auVar66,0xdd);
            auVar63 = vshuff64x2_avx512f(auVar67,auVar68,0xdd);
            auVar65 = vshuff64x2_avx512f(auVar69,auVar70,0xdd);
            auVar66 = vshuff64x2_avx512f(auVar71,auVar72,0xdd);
            in_ZMM4 = vshuff64x2_avx512f(auVar51,auVar55,0xdd);
            in_ZMM3 = vshuff64x2_avx512f(auVar50,auVar52,0xdd);
            auVar50 = vshuff64x2_avx512f(auVar54,auVar56,0xdd);
            auVar49 = vshuff64x2_avx512f(auVar49,auVar53,0xdd);
            *pauVar45 = auVar57;
            pauVar45[1] = auVar58;
            pauVar45[2] = auVar59;
            pauVar45[3] = auVar60;
            pauVar45[4] = auVar61;
            pauVar45[5] = auVar62;
            pauVar45[6] = in_ZMM17;
            pauVar45[7] = auVar64;
            pauVar45[8] = in_ZMM16;
            pauVar45[9] = auVar63;
            pauVar45[10] = auVar65;
            pauVar45[0xb] = auVar66;
            pauVar45[0xc] = in_ZMM4;
            pauVar45[0xd] = in_ZMM3;
            pauVar45[0xe] = auVar50;
            pauVar45[0xf] = auVar49;
            pauVar45 = pauVar45 + 0x10;
            lVar42 = lVar42 + 4;
          } while (uVar44 * 4 != lVar42);
        }
        pvVar10 = (void *)((long)pvVar10 + lVar24);
        iVar26 = iVar32 + 0x1f;
        pvVar25 = (void *)((long)pvVar25 + lVar24);
        local_f8 = (void *)((long)local_f8 + lVar24);
        pvVar33 = (void *)((long)pvVar33 + lVar24);
        pvVar27 = (void *)((long)pvVar27 + lVar24);
        pvVar41 = (void *)((long)pvVar41 + lVar24);
        pvVar17 = (void *)((long)pvVar17 + lVar24);
        pvVar36 = (void *)((long)pvVar36 + lVar24);
        pvVar39 = (void *)((long)pvVar39 + lVar24);
        pvVar46 = (void *)((long)pvVar46 + lVar24);
        pvVar20 = (void *)((long)pvVar20 + lVar24);
        local_128 = (void *)((long)local_128 + lVar24);
        local_108 = (void *)((long)local_108 + lVar24);
        local_130 = (void *)((long)local_130 + lVar24);
        pvVar35 = (void *)((long)pvVar35 + lVar24);
        pvVar34 = (void *)((long)pvVar34 + lVar24);
        iVar32 = iVar32 + 0x10;
      } while (iVar26 < inch);
      uVar14 = (ulong)(inch & 0xfffffff0);
    }
    uVar22 = (uint)uVar14 | 7;
    while (uVar23 = (uint)uVar14, (int)uVar22 < inch) {
      if (0 < (int)uVar43) {
        uVar28 = 0;
        pvVar33 = pvVar10;
        do {
          pauVar37 = pauVar45;
          lVar42 = 0;
          pvVar17 = pvVar33;
          do {
            lVar40 = lVar42;
            auVar49 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar17 + uVar14 * 4));
            *(undefined1 (*) [64])((long)*pauVar37 + lVar40) = auVar49;
            pvVar17 = (void *)((long)pvVar17 + lVar16);
            lVar42 = lVar40 + 0x40;
          } while ((int)(lVar40 + 0x40) != 0x200);
          uVar28 = uVar28 + 1;
          pvVar33 = (void *)((long)pvVar33 + 4);
          pauVar45 = (undefined1 (*) [64])(pauVar37[1] + lVar40);
        } while (uVar28 != uVar44);
        pauVar45 = (undefined1 (*) [64])(pauVar37[1] + lVar40);
      }
      pvVar10 = (void *)((long)pvVar10 + (long)(int)(uVar43 * 8) * 4);
      uVar14 = (ulong)(uVar23 + 8);
      uVar22 = uVar23 + 0xf;
    }
    uVar23 = uVar23 | 3;
    while (uVar22 = (uint)uVar14, (int)uVar23 < inch) {
      if (0 < (int)uVar43) {
        uVar28 = 0;
        pvVar33 = pvVar10;
        do {
          pauVar37 = pauVar45;
          lVar42 = 0;
          pvVar17 = pvVar33;
          do {
            lVar40 = lVar42;
            auVar49 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar17 + uVar14 * 4));
            *(undefined1 (*) [64])((long)*pauVar37 + lVar40) = auVar49;
            pvVar17 = (void *)((long)pvVar17 + lVar16);
            lVar42 = lVar40 + 0x40;
          } while ((int)(lVar40 + 0x40) != 0x100);
          uVar28 = uVar28 + 1;
          pvVar33 = (void *)((long)pvVar33 + 4);
          pauVar45 = (undefined1 (*) [64])(pauVar37[1] + lVar40);
        } while (uVar28 != uVar44);
        pauVar45 = (undefined1 (*) [64])(pauVar37[1] + lVar40);
      }
      pvVar10 = (void *)((long)pvVar10 + (long)(int)(uVar43 * 4) * 4);
      uVar14 = (ulong)(uVar22 + 4);
      uVar23 = uVar22 + 7;
    }
    if ((int)(uVar22 | 1) < inch) {
      pvVar33 = (void *)((long)pvVar10 + lVar16);
      do {
        if (0 < (int)uVar43) {
          lVar42 = 0;
          do {
            auVar49 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar10 + uVar14 * 4 + lVar42));
            *pauVar45 = auVar49;
            auVar49 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar33 + uVar14 * 4 + lVar42));
            pauVar45[1] = auVar49;
            pauVar45 = pauVar45 + 2;
            lVar42 = lVar42 + 4;
          } while (uVar44 * 4 != lVar42);
        }
        pvVar10 = (void *)((long)pvVar10 + lVar38);
        iVar32 = (int)uVar14;
        uVar22 = iVar32 + 2;
        pvVar33 = (void *)((long)pvVar33 + lVar38);
        uVar14 = (ulong)uVar22;
      } while (iVar32 + 3 < inch);
    }
    if ((int)uVar22 < inch) {
      do {
        uVar14 = uVar44;
        pvVar33 = pvVar10;
        if (0 < (int)uVar43) {
          do {
            auVar49 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar33 + uVar14 * 4));
            *pauVar45 = auVar49;
            pauVar45 = pauVar45 + 1;
            pvVar33 = (void *)((long)pvVar33 + 4);
            uVar14 = uVar14 - 1;
          } while (uVar14 != 0);
        }
        uVar22 = uVar22 + 1;
      } while (uVar22 != inch);
    }
    uVar14 = uVar29 + 0x10;
    uVar28 = uVar29 + 0x1f;
    local_b8 = local_b8 + iVar30;
    local_ac = local_ac + iVar30;
    local_bc = local_bc + iVar30;
    local_c0 = local_c0 + iVar30;
    local_c4 = local_c4 + iVar30;
    local_c8 = local_c8 + iVar30;
    local_cc = local_cc + iVar30;
    local_b0 = local_b0 + iVar30;
    local_b4 = local_b4 + iVar30;
    local_d0 = local_d0 + iVar30;
    iVar15 = iVar15 + iVar30;
    iVar31 = iVar31 + iVar30;
    iVar21 = iVar21 + iVar30;
    iVar12 = iVar12 + iVar30;
    local_d4 = local_d4 + iVar30;
    iVar9 = iVar9 + iVar30;
    uVar29 = uVar14;
  } while (uVar28 < (uint)outch);
LAB_00182c00:
  uVar22 = (uint)uVar14;
  if ((int)(uVar22 | 7) < outch) {
    iVar9 = uVar43 * inch;
    auVar49 = vpbroadcastd_avx512f();
    auVar50 = vpmovsxbd_avx512f(_DAT_005a6860);
    auVar73 = vpmulld_avx2(auVar49._0_32_,auVar50._0_32_);
    vpmulld_avx512f(auVar49,auVar50);
    auVar48 = vpbroadcastd_avx512vl();
    vpmulld_avx2(auVar73,auVar48);
    iVar32 = iVar9 * (uVar22 | 7);
    lVar24 = (long)(int)(uVar43 * 0x10) * 4;
    iVar13 = (uVar22 + 6) * iVar9;
    iVar30 = (uVar22 + 5) * iVar9;
    iVar15 = (uVar22 + 4) * iVar9;
    iVar21 = (uVar22 + 3) * iVar9;
    iVar12 = (uVar22 + 2) * iVar9;
    local_144 = (uVar22 + 1) * iVar9;
    iVar31 = uVar22 * iVar9;
    iVar9 = iVar9 * 8;
    lVar16 = uVar44 * 4;
    uVar29 = uVar14 & 0xffffffff;
    do {
      pauVar45 = (undefined1 (*) [64])
                 ((ulong)(((uint)(uVar29 >> 4) & 0xfffffff) + (uint)(((uint)uVar29 >> 3 & 1) != 0))
                  * kernel_tm->cstep * kernel_tm->elemsize + (long)kernel_tm->data);
      pvVar10 = kernel->data;
      if (inch < 0x10) {
        uVar22 = 0;
      }
      else {
        pvVar27 = (void *)((long)iVar32 * 4 + (long)pvVar10);
        pvVar35 = (void *)((long)iVar13 * 4 + (long)pvVar10);
        pvVar34 = (void *)((long)iVar30 * 4 + (long)pvVar10);
        pvVar17 = (void *)((long)iVar15 * 4 + (long)pvVar10);
        pvVar25 = (void *)((long)iVar21 * 4 + (long)pvVar10);
        pvVar20 = (void *)((long)iVar12 * 4 + (long)pvVar10);
        pvVar33 = (void *)((long)local_144 * 4 + (long)pvVar10);
        pvVar10 = (void *)((long)iVar31 * 4 + (long)pvVar10);
        iVar26 = 0;
        do {
          if (0 < (int)uVar43) {
            lVar38 = 0;
            do {
              auVar49 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar10 + lVar38 * 5));
              auVar50 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar33 + lVar38 * 5));
              auVar51 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar20 + lVar38 * 5));
              auVar52 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar25 + lVar38 * 5));
              auVar53 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar17 + lVar38 * 5));
              auVar54 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar34 + lVar38 * 5));
              auVar55 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar35 + lVar38 * 5));
              auVar56 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar27 + lVar38 * 5));
              auVar57 = vunpcklps_avx512f(auVar49,auVar50);
              auVar49 = vunpckhps_avx512f(auVar49,auVar50);
              auVar50 = vunpcklps_avx512f(auVar51,auVar52);
              auVar51 = vunpckhps_avx512f(auVar51,auVar52);
              auVar52 = vunpcklps_avx512f(auVar53,auVar54);
              auVar53 = vunpckhps_avx512f(auVar53,auVar54);
              auVar54 = vunpcklps_avx512f(auVar55,auVar56);
              auVar55 = vunpckhps_avx512f(auVar55,auVar56);
              auVar56 = vunpcklpd_avx512f(auVar57,auVar50);
              auVar50 = vunpckhpd_avx512f(auVar57,auVar50);
              auVar57 = vunpcklpd_avx512f(auVar49,auVar51);
              auVar49 = vunpckhpd_avx512f(auVar49,auVar51);
              auVar51 = vunpcklpd_avx512f(auVar52,auVar54);
              auVar52 = vunpckhpd_avx512f(auVar52,auVar54);
              auVar54 = vunpcklpd_avx512f(auVar53,auVar55);
              auVar53 = vunpckhpd_avx512f(auVar53,auVar55);
              auVar55 = vshuff64x2_avx512f(auVar56,auVar51,0x88);
              auVar58 = vshuff64x2_avx512f(auVar50,auVar52,0x88);
              auVar59 = vshuff64x2_avx512f(auVar57,auVar54,0x88);
              auVar60 = vshuff64x2_avx512f(auVar49,auVar53,0x88);
              auVar51 = vshuff64x2_avx512f(auVar56,auVar51,0xdd);
              auVar50 = vshuff64x2_avx512f(auVar50,auVar52,0xdd);
              auVar52 = vshuff64x2_avx512f(auVar57,auVar54,0xdd);
              auVar49 = vshuff64x2_avx512f(auVar49,auVar53,0xdd);
              auVar53 = vshuff64x2_avx512f(auVar55,auVar58,0x88);
              auVar54 = vshuff64x2_avx512f(auVar59,auVar60,0x88);
              auVar56 = vshuff64x2_avx512f(auVar51,auVar50,0x88);
              auVar57 = vshuff64x2_avx512f(auVar52,auVar49,0x88);
              auVar55 = vshuff64x2_avx512f(auVar55,auVar58,0xdd);
              auVar58 = vshuff64x2_avx512f(auVar59,auVar60,0xdd);
              in_ZMM4 = vshuff64x2_avx512f(auVar51,auVar50,0xdd);
              in_ZMM3 = vshuff64x2_avx512f(auVar52,auVar49,0xdd);
              *pauVar45 = auVar53;
              pauVar45[1] = auVar54;
              pauVar45[2] = auVar56;
              pauVar45[3] = auVar57;
              pauVar45[4] = auVar55;
              pauVar45[5] = auVar58;
              pauVar45[6] = in_ZMM4;
              pauVar45[7] = in_ZMM3;
              pauVar45 = pauVar45 + 8;
              lVar38 = lVar38 + 4;
            } while (lVar16 - lVar38 != 0);
          }
          pvVar10 = (void *)((long)pvVar10 + lVar24);
          pvVar33 = (void *)((long)pvVar33 + lVar24);
          pvVar20 = (void *)((long)pvVar20 + lVar24);
          pvVar25 = (void *)((long)pvVar25 + lVar24);
          pvVar17 = (void *)((long)pvVar17 + lVar24);
          pvVar34 = (void *)((long)pvVar34 + lVar24);
          pvVar35 = (void *)((long)pvVar35 + lVar24);
          pvVar27 = (void *)((long)pvVar27 + lVar24);
          iVar19 = iVar26 + 0x1f;
          iVar26 = iVar26 + 0x10;
          uVar22 = inch & 0xfffffff0;
        } while (iVar19 < inch);
      }
      uVar23 = uVar22 | 7;
      while ((int)uVar23 < inch) {
        if (0 < (int)uVar43) {
          lVar38 = 0;
          do {
            auVar73 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
            auVar48 = vgatherdps(ZEXT832(0) << 0x40,auVar73);
            auVar73 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar74 = vgatherdps(ZEXT832(0) << 0x40,auVar73);
            auVar73 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar75 = vgatherdps(ZEXT832(0) << 0x40,auVar73);
            auVar73 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar76 = vgatherdps(ZEXT832(0) << 0x40,auVar73);
            auVar73 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar77 = vgatherdps(ZEXT832(0) << 0x40,auVar73);
            auVar73 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar78 = vgatherdps(ZEXT832(0) << 0x40,auVar73);
            auVar73 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar79 = vgatherdps(ZEXT832(0) << 0x40,auVar73);
            auVar73 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar81 = vgatherdps(ZEXT832(0) << 0x40,auVar73);
            auVar73 = vunpcklps_avx(auVar48,auVar74);
            auVar48 = vunpckhps_avx(auVar48,auVar74);
            auVar3 = vunpcklps_avx(auVar75,auVar76);
            auVar74 = vunpckhps_avx(auVar75,auVar76);
            auVar4 = vunpcklps_avx(auVar77,auVar78);
            auVar75 = vunpckhps_avx(auVar77,auVar78);
            auVar80 = vunpcklps_avx(auVar79,auVar81);
            auVar76 = vunpckhps_avx(auVar79,auVar81);
            auVar77 = vunpcklpd_avx(auVar73,auVar3);
            auVar73 = vunpckhpd_avx(auVar73,auVar3);
            auVar3 = vunpcklpd_avx(auVar48,auVar74);
            auVar48 = vunpckhpd_avx(auVar48,auVar74);
            auVar78 = vunpcklpd_avx(auVar4,auVar80);
            auVar74 = vunpckhpd_avx(auVar4,auVar80);
            auVar4 = vunpcklpd_avx(auVar75,auVar76);
            auVar75 = vunpckhpd_avx(auVar75,auVar76);
            auVar80._16_16_ = auVar78._0_16_;
            auVar80._0_16_ = auVar77._0_16_;
            auVar79._16_16_ = auVar74._0_16_;
            auVar79._0_16_ = auVar73._0_16_;
            auVar81._16_16_ = auVar4._0_16_;
            auVar81._0_16_ = auVar3._0_16_;
            auVar82._16_16_ = auVar75._0_16_;
            auVar82._0_16_ = auVar48._0_16_;
            auVar76 = vperm2f128_avx(auVar77,auVar78,0x31);
            auVar73 = vperm2f128_avx(auVar73,auVar74,0x31);
            in_ZMM3 = ZEXT3264(auVar73);
            auVar74 = vperm2f128_avx(auVar3,auVar4,0x31);
            auVar48 = vperm2f128_avx(auVar48,auVar75,0x31);
            in_ZMM4 = ZEXT3264(auVar48);
            *(undefined1 (*) [32])*pauVar45 = auVar80;
            *(undefined1 (*) [32])((long)*pauVar45 + 0x20) = auVar79;
            *(undefined1 (*) [32])pauVar45[1] = auVar81;
            *(undefined1 (*) [32])(pauVar45[1] + 0x20) = auVar82;
            *(undefined1 (*) [32])pauVar45[2] = auVar76;
            *(undefined1 (*) [32])(pauVar45[2] + 0x20) = auVar73;
            *(undefined1 (*) [32])pauVar45[3] = auVar74;
            *(undefined1 (*) [32])(pauVar45[3] + 0x20) = auVar48;
            pauVar45 = pauVar45 + 4;
            lVar38 = lVar38 + 4;
          } while (lVar16 - lVar38 != 0);
        }
        uVar23 = uVar22 + 0xf;
        uVar22 = uVar22 + 8;
      }
      uVar23 = uVar22 | 3;
      while ((int)uVar23 < inch) {
        if (0 < (int)uVar43) {
          uVar14 = 0;
          do {
            pauVar37 = pauVar45;
            lVar38 = 0;
            do {
              auVar73 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
              auVar73 = vgatherdps(ZEXT832(0) << 0x40,auVar73);
              in_ZMM4 = ZEXT3264(auVar73);
              in_ZMM3 = ZEXT3264((undefined1  [32])0x0);
              *(undefined1 (*) [32])((long)*pauVar37 + lVar38) = auVar73;
              lVar38 = lVar38 + 0x20;
            } while ((int)lVar38 != 0x80);
            uVar14 = uVar14 + 1;
            pauVar45 = (undefined1 (*) [64])((long)*pauVar37 + lVar38);
          } while (uVar14 != uVar44);
          pauVar45 = (undefined1 (*) [64])((long)*pauVar37 + lVar38);
        }
        uVar23 = uVar22 + 7;
        uVar22 = uVar22 + 4;
      }
      uVar23 = uVar22 | 1;
      while ((int)uVar23 < inch) {
        if (0 < (int)uVar43) {
          lVar38 = 0;
          do {
            auVar73 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
            auVar73 = vgatherdps(ZEXT832(0) << 0x40,auVar73);
            *(undefined1 (*) [32])*pauVar45 = auVar73;
            auVar73 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar73 = vgatherdps(ZEXT832(0) << 0x20,auVar73);
            in_ZMM4 = ZEXT3264(auVar73);
            in_ZMM3 = ZEXT3264((undefined1  [32])0x0);
            *(undefined1 (*) [32])((long)*pauVar45 + 0x20) = auVar73;
            pauVar45 = pauVar45 + 1;
            lVar38 = lVar38 + 4;
          } while (lVar16 - lVar38 != 0);
        }
        uVar23 = uVar22 + 3;
        uVar22 = uVar22 + 2;
      }
      if ((int)uVar22 < inch) {
        do {
          uVar14 = uVar44;
          if (0 < (int)uVar43) {
            do {
              auVar73 = vpcmpeqd_avx2(in_ZMM3._0_32_,in_ZMM3._0_32_);
              auVar73 = vgatherdps(ZEXT1632(ZEXT816(0) << 0x40),auVar73);
              in_ZMM4 = ZEXT3264(auVar73);
              in_ZMM3 = ZEXT3264((undefined1  [32])0x0);
              *(undefined1 (*) [32])*pauVar45 = auVar73;
              pauVar45 = (undefined1 (*) [64])((long)*pauVar45 + 0x20);
              uVar14 = uVar14 - 1;
            } while (uVar14 != 0);
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != inch);
      }
      uVar14 = uVar29 + 8;
      lVar38 = uVar29 + 0xf;
      iVar32 = iVar32 + iVar9;
      iVar13 = iVar13 + iVar9;
      iVar30 = iVar30 + iVar9;
      iVar15 = iVar15 + iVar9;
      iVar21 = iVar21 + iVar9;
      iVar12 = iVar12 + iVar9;
      local_144 = local_144 + iVar9;
      iVar31 = iVar31 + iVar9;
      uVar29 = uVar14;
    } while (lVar38 < outch);
    uVar14 = uVar14 & 0xffffffff;
  }
  uVar22 = (uint)uVar14;
  if ((int)(uVar22 | 3) < outch) {
    iVar9 = uVar43 * inch;
    auVar49 = vpbroadcastd_avx512f();
    auVar50 = vpmovsxbd_avx512f(_DAT_005a6860);
    auVar1 = vpmulld_avx(auVar49._0_16_,auVar50._0_16_);
    vpmulld_avx2(auVar49._0_32_,auVar50._0_32_);
    vpmulld_avx512f(auVar49,auVar50);
    lVar38 = (long)(int)(uVar43 * 8);
    auVar47 = vpbroadcastd_avx512vl();
    vpmulld_avx(auVar1,auVar47);
    iVar12 = iVar9 * (uVar22 | 3);
    iVar31 = iVar9 * 4;
    lVar24 = (long)(int)(uVar43 * 0x10) * 4;
    iVar15 = (uVar22 + 2) * iVar9;
    iVar21 = (uVar22 + 1) * iVar9;
    iVar9 = uVar22 * iVar9;
    lVar16 = uVar44 * 4;
    uVar14 = uVar14 & 0xffffffff;
    do {
      pauVar45 = (undefined1 (*) [64])
                 ((ulong)(((uint)(uVar14 >> 3) & 1) + ((uint)(uVar14 >> 4) & 0xfffffff) +
                         (uint)(((uint)uVar14 >> 2 & 1) != 0)) * kernel_tm->cstep *
                  kernel_tm->elemsize + (long)kernel_tm->data);
      pvVar10 = kernel->data;
      if (inch < 0x10) {
        uVar22 = 0;
      }
      else {
        pvVar33 = (void *)((long)iVar12 * 4 + (long)pvVar10);
        pvVar20 = (void *)((long)iVar15 * 4 + (long)pvVar10);
        pvVar17 = (void *)((long)iVar21 * 4 + (long)pvVar10);
        pvVar10 = (void *)((long)iVar9 * 4 + (long)pvVar10);
        iVar13 = 0;
        do {
          if (0 < (int)uVar43) {
            lVar42 = 0;
            do {
              auVar49 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar10 + lVar38 * 0x10 + lVar42));
              auVar50 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar17 + lVar38 * 0x10 + lVar42));
              auVar51 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar20 + lVar38 * 0x10 + lVar42));
              auVar52 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar33 + lVar38 * 0x10 + lVar42));
              auVar53 = vunpcklps_avx512f(auVar49,auVar50);
              auVar49 = vunpckhps_avx512f(auVar49,auVar50);
              auVar50 = vunpcklps_avx512f(auVar51,auVar52);
              auVar51 = vunpckhps_avx512f(auVar51,auVar52);
              auVar52 = vunpcklpd_avx512f(auVar53,auVar50);
              auVar50 = vunpckhpd_avx512f(auVar53,auVar50);
              auVar53 = vunpcklpd_avx512f(auVar49,auVar51);
              auVar49 = vunpckhpd_avx512f(auVar49,auVar51);
              auVar51 = vshuff64x2_avx512f(auVar52,auVar50,0x88);
              auVar54 = vshuff64x2_avx512f(auVar53,auVar49,0x88);
              auVar50 = vshuff64x2_avx512f(auVar52,auVar50,0xdd);
              auVar49 = vshuff64x2_avx512f(auVar53,auVar49,0xdd);
              auVar52 = vshuff64x2_avx512f(auVar51,auVar54,0x88);
              auVar53 = vshuff64x2_avx512f(auVar50,auVar49,0x88);
              auVar51 = vshuff64x2_avx512f(auVar51,auVar54,0xdd);
              in_ZMM4 = vshuff64x2_avx512f(auVar50,auVar49,0xdd);
              *pauVar45 = auVar52;
              pauVar45[1] = auVar53;
              pauVar45[2] = auVar51;
              pauVar45[3] = in_ZMM4;
              pauVar45 = pauVar45 + 4;
              lVar42 = lVar42 + 4;
            } while (lVar16 - lVar42 != 0);
          }
          pvVar10 = (void *)((long)pvVar10 + lVar24);
          pvVar17 = (void *)((long)pvVar17 + lVar24);
          pvVar20 = (void *)((long)pvVar20 + lVar24);
          pvVar33 = (void *)((long)pvVar33 + lVar24);
          iVar30 = iVar13 + 0x1f;
          iVar13 = iVar13 + 0x10;
          uVar22 = inch & 0xfffffff0;
        } while (iVar30 < inch);
      }
      uVar23 = uVar22 | 7;
      while ((int)uVar23 < inch) {
        if (0 < (int)uVar43) {
          lVar42 = 0;
          do {
            auVar73 = vpcmpeqd_avx2(in_ZMM4._0_32_,in_ZMM4._0_32_);
            auVar48 = vgatherdps(ZEXT832(0) << 0x40,auVar73);
            auVar73 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar74 = vgatherdps(ZEXT832(0) << 0x40,auVar73);
            auVar73 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar75 = vgatherdps(ZEXT832(0) << 0x40,auVar73);
            auVar73 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar77 = vgatherdps(ZEXT832(0) << 0x40,auVar73);
            auVar73 = vunpcklps_avx(auVar48,auVar74);
            auVar48 = vunpckhps_avx(auVar48,auVar74);
            auVar76 = vunpcklps_avx(auVar75,auVar77);
            auVar74 = vunpckhps_avx(auVar75,auVar77);
            auVar75 = vunpcklpd_avx(auVar73,auVar76);
            auVar73 = vunpckhpd_avx(auVar73,auVar76);
            auVar76 = vunpcklpd_avx(auVar48,auVar74);
            auVar48 = vunpckhpd_avx(auVar48,auVar74);
            auVar74._16_16_ = auVar73._0_16_;
            auVar74._0_16_ = auVar75._0_16_;
            auVar77._16_16_ = auVar48._0_16_;
            auVar77._0_16_ = auVar76._0_16_;
            auVar73 = vperm2f128_avx(auVar75,auVar73,0x31);
            in_ZMM4 = ZEXT3264(auVar73);
            auVar48 = vperm2f128_avx(auVar76,auVar48,0x31);
            *(undefined1 (*) [32])*pauVar45 = auVar74;
            *(undefined1 (*) [32])((long)*pauVar45 + 0x20) = auVar77;
            *(undefined1 (*) [32])pauVar45[1] = auVar73;
            *(undefined1 (*) [32])(pauVar45[1] + 0x20) = auVar48;
            pauVar45 = pauVar45 + 2;
            lVar42 = lVar42 + 4;
          } while (lVar16 - lVar42 != 0);
        }
        uVar23 = uVar22 + 0xf;
        uVar22 = uVar22 + 8;
      }
      uVar23 = uVar22 | 3;
      while ((int)uVar23 < inch) {
        if (0 < (int)uVar43) {
          lVar42 = 0;
          do {
            auVar1 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
            auVar5 = vgatherdps(ZEXT816(0) << 0x40,auVar1);
            auVar1 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar6 = vgatherdps(ZEXT816(0) << 0x40,auVar1);
            auVar1 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar7 = vgatherdps(ZEXT816(0) << 0x40,auVar1);
            auVar1 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar1 = vgatherdps(ZEXT816(0) << 0x40,auVar1);
            auVar47 = vunpcklps_avx(auVar5,auVar6);
            auVar2 = vunpcklps_avx(auVar7,auVar1);
            auVar5 = vunpckhps_avx(auVar5,auVar6);
            auVar6 = vunpckhps_avx(auVar7,auVar1);
            auVar1 = vmovlhps_avx(auVar47,auVar2);
            auVar2 = vunpckhpd_avx(auVar47,auVar2);
            in_ZMM4 = ZEXT1664(auVar2);
            auVar47 = vmovlhps_avx(auVar5,auVar6);
            auVar5 = vunpckhpd_avx(auVar5,auVar6);
            *(undefined1 (*) [16])*pauVar45 = auVar1;
            *(undefined1 (*) [16])((long)*pauVar45 + 0x10) = auVar2;
            *(undefined1 (*) [16])((long)*pauVar45 + 0x20) = auVar47;
            *(undefined1 (*) [16])((long)*pauVar45 + 0x30) = auVar5;
            pauVar45 = pauVar45 + 1;
            lVar42 = lVar42 + 4;
          } while (lVar16 - lVar42 != 0);
        }
        uVar23 = uVar22 + 7;
        uVar22 = uVar22 + 4;
      }
      uVar23 = uVar22 | 1;
      while ((int)uVar23 < inch) {
        if (0 < (int)uVar43) {
          lVar42 = 0;
          do {
            auVar1 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
            auVar1 = vgatherdps(ZEXT816(0) << 0x40,auVar1);
            *(undefined1 (*) [16])*pauVar45 = auVar1;
            auVar1 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar1 = vgatherdps(ZEXT816(0) << 0x20,auVar1);
            in_ZMM4 = ZEXT1664((undefined1  [16])0x0);
            *(undefined1 (*) [16])((long)*pauVar45 + 0x10) = auVar1;
            pauVar45 = (undefined1 (*) [64])((long)*pauVar45 + 0x20);
            lVar42 = lVar42 + 4;
          } while (lVar16 - lVar42 != 0);
        }
        uVar23 = uVar22 + 3;
        uVar22 = uVar22 + 2;
      }
      if ((int)uVar22 < inch) {
        do {
          uVar29 = uVar44;
          if (0 < (int)uVar43) {
            do {
              auVar1 = vpcmpeqd_avx(in_ZMM4._0_16_,in_ZMM4._0_16_);
              auVar1 = vgatherdps(ZEXT816(0) << 0x40,auVar1);
              in_ZMM4 = ZEXT1664((undefined1  [16])0x0);
              *(undefined1 (*) [16])*pauVar45 = auVar1;
              pauVar45 = (undefined1 (*) [64])((long)*pauVar45 + 0x10);
              uVar29 = uVar29 - 1;
            } while (uVar29 != 0);
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != inch);
      }
      uVar29 = uVar14 + 4;
      lVar42 = uVar14 + 7;
      iVar12 = iVar12 + iVar31;
      iVar15 = iVar15 + iVar31;
      iVar21 = iVar21 + iVar31;
      iVar9 = iVar9 + iVar31;
      uVar14 = uVar29;
    } while (lVar42 < outch);
    uVar22 = (uint)uVar29;
  }
  uVar23 = uVar22 | 1;
  if ((int)uVar23 < outch) {
    iVar21 = uVar43 * inch;
    auVar50 = vpbroadcastd_avx512f();
    auVar49 = vpmovsxbd_avx512f(_DAT_005a6860);
    vpmulld_avx(auVar50._0_16_,auVar49._0_16_);
    vpmulld_avx2(auVar50._0_32_,auVar49._0_32_);
    vpmulld_avx512f(auVar50,auVar49);
    lVar24 = (long)(int)(uVar43 * 8);
    iVar15 = iVar21 * uVar23;
    lVar40 = (long)(int)(uVar43 * 0x10) * 4;
    iVar12 = uVar22 * iVar21;
    lVar16 = uVar44 * 4;
    lVar38 = (long)(int)(uVar43 * 4) * 4;
    lVar42 = (long)(int)(uVar43 * 2) * 4;
    uVar14 = (long)(int)uVar22;
    do {
      uVar22 = (uint)uVar14;
      pauVar45 = (undefined1 (*) [64])
                 ((ulong)(((uint)(uVar14 >> 2) & 1) +
                          ((uint)(uVar14 >> 4) & 0xfffffff) + (uint)((uVar22 >> 3 & 1) != 0) +
                         (uint)((uVar22 >> 1 & 1) != 0)) * kernel_tm->cstep * kernel_tm->elemsize +
                 (long)kernel_tm->data);
      pvVar10 = kernel->data;
      if (inch < 0x10) {
        pvVar33 = (void *)((long)pvVar10 + (long)(int)(iVar21 * uVar22) * 4);
        pvVar17 = (void *)((long)pvVar10 + (long)(int)(uVar23 * iVar21) * 4);
        uVar22 = 0;
      }
      else {
        pvVar17 = (void *)((long)iVar15 * 4 + (long)pvVar10);
        pvVar33 = (void *)((long)iVar12 * 4 + (long)pvVar10);
        iVar31 = 0;
        do {
          if (0 < (int)uVar43) {
            lVar18 = 0;
            do {
              auVar49 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar33 + lVar24 * 0x10 + lVar18));
              auVar50 = vgatherdps_avx512f(*(undefined4 *)((long)pvVar17 + lVar24 * 0x10 + lVar18));
              *pauVar45 = auVar49;
              pauVar45[1] = auVar50;
              pauVar45 = pauVar45 + 2;
              lVar18 = lVar18 + 4;
            } while (lVar16 - lVar18 != 0);
          }
          pvVar33 = (void *)((long)pvVar33 + lVar40);
          pvVar17 = (void *)((long)pvVar17 + lVar40);
          iVar9 = iVar31 + 0x1f;
          iVar31 = iVar31 + 0x10;
          uVar22 = inch & 0xfffffff0;
        } while (iVar9 < inch);
      }
      uVar23 = uVar22 | 7;
      while ((int)uVar23 < inch) {
        if (0 < (int)uVar43) {
          lVar18 = 0;
          do {
            auVar73 = vpcmpeqd_avx2(auVar49._0_32_,auVar49._0_32_);
            auVar48 = vgatherdps(ZEXT832(0) << 0x40,auVar73);
            auVar73 = vpcmpeqd_avx2((undefined1  [32])0x0,(undefined1  [32])0x0);
            auVar73 = vgatherdps(ZEXT832(0) << 0x40,auVar73);
            auVar49 = ZEXT3264((undefined1  [32])0x0);
            *(undefined1 (*) [32])*pauVar45 = auVar48;
            *(undefined1 (*) [32])((long)*pauVar45 + 0x20) = auVar73;
            pauVar45 = pauVar45 + 1;
            lVar18 = lVar18 + 4;
          } while (lVar16 - lVar18 != 0);
        }
        pvVar33 = (void *)((long)pvVar33 + lVar24 * 4);
        pvVar17 = (void *)((long)pvVar17 + lVar24 * 4);
        uVar23 = uVar22 + 0xf;
        uVar22 = uVar22 + 8;
      }
      uVar23 = uVar22 | 3;
      while ((int)uVar23 < inch) {
        if (0 < (int)uVar43) {
          lVar18 = 0;
          do {
            auVar1 = vpcmpeqd_avx(auVar49._0_16_,auVar49._0_16_);
            auVar47 = vgatherdps(ZEXT816(0) << 0x40,auVar1);
            auVar1 = vpcmpeqd_avx((undefined1  [16])0x0,(undefined1  [16])0x0);
            auVar1 = vgatherdps(ZEXT816(0) << 0x40,auVar1);
            auVar49 = ZEXT1664((undefined1  [16])0x0);
            *(undefined1 (*) [16])*pauVar45 = auVar47;
            *(undefined1 (*) [16])((long)*pauVar45 + 0x10) = auVar1;
            pauVar45 = (undefined1 (*) [64])((long)*pauVar45 + 0x20);
            lVar18 = lVar18 + 4;
          } while (lVar16 - lVar18 != 0);
        }
        pvVar33 = (void *)((long)pvVar33 + lVar38);
        pvVar17 = (void *)((long)pvVar17 + lVar38);
        uVar23 = uVar22 + 7;
        uVar22 = uVar22 + 4;
      }
      uVar23 = uVar22 | 1;
      while ((int)uVar23 < inch) {
        if (0 < (int)uVar43) {
          uVar29 = 0;
          pvVar10 = pvVar17;
          pvVar20 = pvVar33;
          do {
            lVar18 = 0;
            bVar8 = true;
            do {
              bVar11 = bVar8;
              *(undefined4 *)*pauVar45 = *(undefined4 *)((long)pvVar20 + lVar18);
              auVar49 = ZEXT464(*(uint *)((long)pvVar10 + lVar18));
              *(uint *)((long)*pauVar45 + 4) = *(uint *)((long)pvVar10 + lVar18);
              pauVar45 = (undefined1 (*) [64])((long)*pauVar45 + 8);
              lVar18 = lVar18 + (long)(int)uVar43 * 4;
              bVar8 = false;
            } while (bVar11);
            uVar29 = uVar29 + 1;
            pvVar10 = (void *)((long)pvVar10 + 4);
            pvVar20 = (void *)((long)pvVar20 + 4);
          } while (uVar29 != uVar44);
        }
        pvVar33 = (void *)((long)pvVar33 + lVar42);
        pvVar17 = (void *)((long)pvVar17 + lVar42);
        uVar23 = uVar22 + 3;
        uVar22 = uVar22 + 2;
      }
      if ((int)uVar22 < inch) {
        do {
          if (0 < (int)uVar43) {
            lVar18 = 0;
            uVar29 = 0;
            do {
              *(undefined4 *)((long)*pauVar45 + uVar29 * 8) =
                   *(undefined4 *)((long)pvVar33 + uVar29 * 4);
              uVar23 = *(uint *)((long)pvVar17 + uVar29 * 4);
              auVar49 = ZEXT464(uVar23);
              *(uint *)((long)*pauVar45 + uVar29 * 8 + 4) = uVar23;
              uVar29 = uVar29 + 1;
              lVar18 = lVar18 + -8;
            } while (uVar44 != uVar29);
            pauVar45 = (undefined1 (*) [64])((long)pauVar45 - lVar18);
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != inch);
      }
      uVar29 = uVar14 + 2;
      lVar18 = uVar14 + 3;
      uVar23 = (uint)lVar18;
      iVar15 = iVar15 + iVar21 * 2;
      iVar12 = iVar12 + iVar21 * 2;
      uVar14 = uVar29;
    } while (lVar18 < outch);
    uVar22 = (uint)uVar29;
  }
  if ((int)uVar22 < outch) {
    iVar15 = uVar43 * inch;
    auVar50 = vpbroadcastd_avx512f();
    auVar49 = vpmovsxbd_avx512f(_DAT_005a6860);
    vpmulld_avx(auVar50._0_16_,auVar49._0_16_);
    vpmulld_avx2(auVar50._0_32_,auVar49._0_32_);
    vpmulld_avx512f(auVar50,auVar49);
    uVar14 = (ulong)(int)uVar22;
    iVar21 = uVar22 * iVar15;
    lVar16 = uVar44 * 4;
    do {
      uVar22 = (uint)uVar14;
      pauVar45 = (undefined1 (*) [64])
                 ((ulong)((uVar22 & 1) + ((uint)(uVar14 >> 4) & 0xfffffff) +
                          (uint)((uVar22 >> 3 & 1) != 0) + ((uint)(uVar14 >> 2) & 1) +
                         (uint)((uVar22 >> 1 & 1) != 0)) * kernel_tm->cstep * kernel_tm->elemsize +
                 (long)kernel_tm->data);
      if (inch < 0x10) {
        pvVar10 = (void *)((long)kernel->data + (long)(int)(iVar15 * uVar22) * 4);
        uVar22 = 0;
      }
      else {
        pvVar10 = (void *)((long)kernel->data + (long)iVar21 * 4);
        iVar12 = 0;
        do {
          if (0 < (int)uVar43) {
            lVar24 = 0;
            do {
              auVar49 = vgatherdps_avx512f(*(undefined4 *)
                                            ((long)pvVar10 + (long)(int)(uVar43 * 8) * 0x10 + lVar24
                                            ));
              *pauVar45 = auVar49;
              pauVar45 = pauVar45 + 1;
              lVar24 = lVar24 + 4;
            } while (lVar16 - lVar24 != 0);
          }
          pvVar10 = (void *)((long)pvVar10 + (long)(int)(uVar43 * 0x10) * 4);
          iVar31 = iVar12 + 0x1f;
          iVar12 = iVar12 + 0x10;
          uVar22 = inch & 0xfffffff0;
        } while (iVar31 < inch);
      }
      uVar23 = uVar22 | 7;
      while ((int)uVar23 < inch) {
        if (0 < (int)uVar43) {
          lVar24 = 0;
          do {
            auVar73 = vpcmpeqd_avx2(auVar49._0_32_,auVar49._0_32_);
            auVar73 = vgatherdps(ZEXT832(0) << 0x40,auVar73);
            auVar49 = ZEXT3264((undefined1  [32])0x0);
            *(undefined1 (*) [32])*pauVar45 = auVar73;
            pauVar45 = (undefined1 (*) [64])((long)*pauVar45 + 0x20);
            lVar24 = lVar24 + 4;
          } while (lVar16 - lVar24 != 0);
        }
        pvVar10 = (void *)((long)pvVar10 + (long)(int)(uVar43 * 8) * 4);
        uVar23 = uVar22 + 0xf;
        uVar22 = uVar22 + 8;
      }
      uVar23 = uVar22 | 3;
      while ((int)uVar23 < inch) {
        if (0 < (int)uVar43) {
          lVar24 = 0;
          do {
            auVar1 = vpcmpeqd_avx(auVar49._0_16_,auVar49._0_16_);
            auVar1 = vgatherdps(ZEXT816(0) << 0x40,auVar1);
            auVar49 = ZEXT1664((undefined1  [16])0x0);
            *(undefined1 (*) [16])*pauVar45 = auVar1;
            pauVar45 = (undefined1 (*) [64])((long)*pauVar45 + 0x10);
            lVar24 = lVar24 + 4;
          } while (lVar16 - lVar24 != 0);
        }
        pvVar10 = (void *)((long)pvVar10 + (long)(int)(uVar43 * 4) * 4);
        uVar23 = uVar22 + 7;
        uVar22 = uVar22 + 4;
      }
      uVar23 = uVar22 | 1;
      while ((int)uVar23 < inch) {
        if (0 < (int)uVar43) {
          uVar29 = 0;
          do {
            *(undefined4 *)*pauVar45 = *(undefined4 *)((long)pvVar10 + uVar29 * 4);
            uVar23 = *(uint *)((long)pvVar10 + uVar29 * 4 + (long)(int)uVar43 * 4);
            auVar49 = ZEXT464(uVar23);
            *(uint *)((long)*pauVar45 + 4) = uVar23;
            pauVar45 = (undefined1 (*) [64])((long)*pauVar45 + 8);
            uVar29 = uVar29 + 1;
          } while (uVar44 != uVar29);
        }
        pvVar10 = (void *)((long)pvVar10 + (long)(int)(uVar43 * 2) * 4);
        uVar23 = uVar22 + 3;
        uVar22 = uVar22 + 2;
      }
      if ((int)uVar22 < inch) {
        do {
          if (0 < (int)uVar43) {
            lVar24 = 0;
            do {
              auVar49 = ZEXT464(*(uint *)((long)pvVar10 + lVar24));
              *(uint *)((long)*pauVar45 + lVar24) = *(uint *)((long)pvVar10 + lVar24);
              lVar24 = lVar24 + 4;
            } while (lVar16 - lVar24 != 0);
            pauVar45 = (undefined1 (*) [64])((long)*pauVar45 + lVar24);
          }
          uVar22 = uVar22 + 1;
        } while (uVar22 != inch);
      }
      uVar14 = uVar14 + 1;
      iVar21 = iVar21 + iVar15;
    } while (uVar14 != (long)outch);
  }
  return;
}

Assistant:

static void convolution_transform_kernel_packed(const Mat& kernel, Mat& kernel_tm, int inch, int outch, int kernel_w, int kernel_h)
{
    const int maxk = kernel_w * kernel_h;

    // src = kw-kh-inch-outch
    // dst = pb-pa-kw-kh-inch/pa-outch/pb

    // clang-format off
    // *INDENT-OFF*
#if __SSE2__
#if __AVX__
#if __AVX512F__
    if (outch >= 16)
    {
        if (inch >= 16)
            kernel_tm.create(16 * 16 * maxk, inch / 16 + (inch % 16) / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 16 + (outch % 16) / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else if (inch >= 8)
            kernel_tm.create(16 * 8 * maxk, inch / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 16 + (outch % 16) / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else if (inch >= 4)
            kernel_tm.create(16 * 4 * maxk, inch / 4 + (inch % 4) / 2 + inch % 2, outch / 16 + (outch % 16) / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else if (inch >= 2)
            kernel_tm.create(16 * 2 * maxk, inch / 2 + inch % 2, outch / 16 + (outch % 16) / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else
            kernel_tm.create(16 * maxk, inch, outch / 16 + (outch % 16) / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
    }
    else
#endif // __AVX512F__
    if (outch >= 8)
    {
#if __AVX512F__
        if (inch >= 16)
            kernel_tm.create(8 * 16 * maxk, inch / 16 + (inch % 16) / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else
#endif // __AVX512F__
        if (inch >= 8)
            kernel_tm.create(8 * 8 * maxk, inch / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else if (inch >= 4)
            kernel_tm.create(8 * 4 * maxk, inch / 4 + (inch % 4) / 2 + inch % 2, outch / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else if (inch >= 2)
            kernel_tm.create(8 * 2 * maxk, inch / 2 + inch % 2, outch / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
        else
            kernel_tm.create(8 * maxk, inch, outch / 8 + (outch % 8) / 4 + (outch % 4) / 2 + outch % 2);
    }
    else
#endif // __AVX__
    if (outch >= 4)
    {
#if __AVX__
#if __AVX512F__
        if (inch >= 16)
            kernel_tm.create(4 * 16 * maxk, inch / 16 + (inch % 16) / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 4 + (outch % 4) / 2 + outch % 2);
        else
#endif // __AVX512F__
        if (inch >= 8)
            kernel_tm.create(4 * 8 * maxk, inch / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 4 + (outch % 4) / 2 + outch % 2);
        else
#endif // __AVX__
        if (inch >= 4)
            kernel_tm.create(4 * 4 * maxk, inch / 4 + (inch % 4) / 2 + inch % 2, outch / 4 + (outch % 4) / 2 + outch % 2);
        else if (inch >= 2)
            kernel_tm.create(4 * 2 * maxk, inch / 2 + inch % 2, outch / 4 + (outch % 4) / 2 + outch % 2);
        else
            kernel_tm.create(4 * maxk, inch, outch / 4 + (outch % 4) / 2 + outch % 2);
    }
    else
#endif // __SSE2__
    if (outch >= 2)
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (inch >= 16)
            kernel_tm.create(2 * 16 * maxk, inch / 16 + (inch % 16) / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 2 + outch % 2);
        else
#endif // __AVX512F__
        if (inch >= 8)
            kernel_tm.create(2 * 8 * maxk, inch / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch / 2 + outch % 2);
        else
#endif // __AVX__
        if (inch >= 4)
            kernel_tm.create(2 * 4 * maxk, inch / 4 + (inch % 4) / 2 + inch % 2, outch / 2 + outch % 2);
        else
#endif // __SSE2__
        if (inch >= 2)
            kernel_tm.create(2 * 2 * maxk, inch / 2 + inch % 2, outch / 2 + outch % 2);
        else
            kernel_tm.create(2 * maxk, inch, outch / 2 + outch % 2);
    }
    else
    {
#if __SSE2__
#if __AVX__
#if __AVX512F__
        if (inch >= 16)
            kernel_tm.create(16 * maxk, inch / 16 + (inch % 16) / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch);
        else
#endif // __AVX512F__
        if (inch >= 8)
            kernel_tm.create(8 * maxk, inch / 8 + (inch % 8) / 4 + (inch % 4) / 2 + inch % 2, outch);
        else
#endif // __AVX__
        if (inch >= 4)
            kernel_tm.create(4 * maxk, inch / 4 + (inch % 4) / 2 + inch % 2, outch);
        else
#endif // __SSE2__
        if (inch >= 2)
            kernel_tm.create(2 * maxk, inch / 2 + inch % 2, outch);
        else
            kernel_tm.create(maxk, inch, outch);
    }
    // *INDENT-ON*
    // clang-format on

    int q = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
    for (; q + 15 < outch; q += 16)
    {
        const float* kptr0 = (const float*)kernel + q * inch * maxk;
        const float* kptr1 = (const float*)kernel + (q + 1) * inch * maxk;
        const float* kptr2 = (const float*)kernel + (q + 2) * inch * maxk;
        const float* kptr3 = (const float*)kernel + (q + 3) * inch * maxk;
        const float* kptr4 = (const float*)kernel + (q + 4) * inch * maxk;
        const float* kptr5 = (const float*)kernel + (q + 5) * inch * maxk;
        const float* kptr6 = (const float*)kernel + (q + 6) * inch * maxk;
        const float* kptr7 = (const float*)kernel + (q + 7) * inch * maxk;
        const float* kptr8 = (const float*)kernel + (q + 8) * inch * maxk;
        const float* kptr9 = (const float*)kernel + (q + 9) * inch * maxk;
        const float* kptra = (const float*)kernel + (q + 10) * inch * maxk;
        const float* kptrb = (const float*)kernel + (q + 11) * inch * maxk;
        const float* kptrc = (const float*)kernel + (q + 12) * inch * maxk;
        const float* kptrd = (const float*)kernel + (q + 13) * inch * maxk;
        const float* kptre = (const float*)kernel + (q + 14) * inch * maxk;
        const float* kptrf = (const float*)kernel + (q + 15) * inch * maxk;

        float* g00 = kernel_tm.channel(q / 16);

        __m512i _vindex = _mm512_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15);
        _vindex = _mm512_mullo_epi32(_vindex, _mm512_set1_epi32(maxk));

        int p = 0;
        for (; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;
                const float* k4 = kptr4 + k;
                const float* k5 = kptr5 + k;
                const float* k6 = kptr6 + k;
                const float* k7 = kptr7 + k;
                const float* k8 = kptr8 + k;
                const float* k9 = kptr9 + k;
                const float* ka = kptra + k;
                const float* kb = kptrb + k;
                const float* kc = kptrc + k;
                const float* kd = kptrd + k;
                const float* ke = kptre + k;
                const float* kf = kptrf + k;

                __m512 _k0 = _mm512_i32gather_ps(_vindex, k0, sizeof(float));
                __m512 _k1 = _mm512_i32gather_ps(_vindex, k1, sizeof(float));
                __m512 _k2 = _mm512_i32gather_ps(_vindex, k2, sizeof(float));
                __m512 _k3 = _mm512_i32gather_ps(_vindex, k3, sizeof(float));
                __m512 _k4 = _mm512_i32gather_ps(_vindex, k4, sizeof(float));
                __m512 _k5 = _mm512_i32gather_ps(_vindex, k5, sizeof(float));
                __m512 _k6 = _mm512_i32gather_ps(_vindex, k6, sizeof(float));
                __m512 _k7 = _mm512_i32gather_ps(_vindex, k7, sizeof(float));
                __m512 _k8 = _mm512_i32gather_ps(_vindex, k8, sizeof(float));
                __m512 _k9 = _mm512_i32gather_ps(_vindex, k9, sizeof(float));
                __m512 _ka = _mm512_i32gather_ps(_vindex, ka, sizeof(float));
                __m512 _kb = _mm512_i32gather_ps(_vindex, kb, sizeof(float));
                __m512 _kc = _mm512_i32gather_ps(_vindex, kc, sizeof(float));
                __m512 _kd = _mm512_i32gather_ps(_vindex, kd, sizeof(float));
                __m512 _ke = _mm512_i32gather_ps(_vindex, ke, sizeof(float));
                __m512 _kf = _mm512_i32gather_ps(_vindex, kf, sizeof(float));

                transpose16x16_ps(_k0, _k1, _k2, _k3, _k4, _k5, _k6, _k7, _k8, _k9, _ka, _kb, _kc, _kd, _ke, _kf);

                _mm512_store_ps(g00, _k0);
                _mm512_store_ps(g00 + 16, _k1);
                _mm512_store_ps(g00 + 16 * 2, _k2);
                _mm512_store_ps(g00 + 16 * 3, _k3);
                _mm512_store_ps(g00 + 16 * 4, _k4);
                _mm512_store_ps(g00 + 16 * 5, _k5);
                _mm512_store_ps(g00 + 16 * 6, _k6);
                _mm512_store_ps(g00 + 16 * 7, _k7);
                _mm512_store_ps(g00 + 16 * 8, _k8);
                _mm512_store_ps(g00 + 16 * 9, _k9);
                _mm512_store_ps(g00 + 16 * 10, _ka);
                _mm512_store_ps(g00 + 16 * 11, _kb);
                _mm512_store_ps(g00 + 16 * 12, _kc);
                _mm512_store_ps(g00 + 16 * 13, _kd);
                _mm512_store_ps(g00 + 16 * 14, _ke);
                _mm512_store_ps(g00 + 16 * 15, _kf);

                g00 += 256;
            }

            kptr0 += maxk * 16;
            kptr1 += maxk * 16;
            kptr2 += maxk * 16;
            kptr3 += maxk * 16;
            kptr4 += maxk * 16;
            kptr5 += maxk * 16;
            kptr6 += maxk * 16;
            kptr7 += maxk * 16;
            kptr8 += maxk * 16;
            kptr9 += maxk * 16;
            kptra += maxk * 16;
            kptrb += maxk * 16;
            kptrc += maxk * 16;
            kptrd += maxk * 16;
            kptre += maxk * 16;
            kptrf += maxk * 16;
        }

        _vindex = _mm512_mullo_epi32(_vindex, _mm512_set1_epi32(inch));

        for (; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;

                for (int i = 0; i < 8; i++)
                {
                    __m512 _k0 = _mm512_i32gather_ps(_vindex, k0, sizeof(float));
                    _mm512_store_ps(g00, _k0);
                    k0 += maxk;
                    g00 += 16;
                }
            }

            kptr0 += maxk * 8;
        }
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;

                for (int i = 0; i < 4; i++)
                {
                    __m512 _k0 = _mm512_i32gather_ps(_vindex, k0, sizeof(float));
                    _mm512_store_ps(g00, _k0);
                    k0 += maxk;
                    g00 += 16;
                }
            }

            kptr0 += maxk * 4;
        }
        for (; p + 1 < inch; p += 2)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;

                for (int i = 0; i < 2; i++)
                {
                    __m512 _k0 = _mm512_i32gather_ps(_vindex, k0, sizeof(float));
                    _mm512_store_ps(g00, _k0);
                    k0 += maxk;
                    g00 += 16;
                }
            }

            kptr0 += maxk * 2;
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;

                __m512 _k0 = _mm512_i32gather_ps(_vindex, k0, sizeof(float));
                _mm512_store_ps(g00, _k0);
                g00 += 16;
            }
        }
    }
#endif // __AVX512F__
    for (; q + 7 < outch; q += 8)
    {
        const float* kptr0 = (const float*)kernel + q * inch * maxk;
        const float* kptr1 = (const float*)kernel + (q + 1) * inch * maxk;
        const float* kptr2 = (const float*)kernel + (q + 2) * inch * maxk;
        const float* kptr3 = (const float*)kernel + (q + 3) * inch * maxk;
        const float* kptr4 = (const float*)kernel + (q + 4) * inch * maxk;
        const float* kptr5 = (const float*)kernel + (q + 5) * inch * maxk;
        const float* kptr6 = (const float*)kernel + (q + 6) * inch * maxk;
        const float* kptr7 = (const float*)kernel + (q + 7) * inch * maxk;

#if __AVX512F__
        float* g00 = kernel_tm.channel(q / 16 + (q % 16) / 8);
#else
        float* g00 = kernel_tm.channel(q / 8);
#endif

#if __AVX2__
        __m256i _vindex = _mm256_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7);
        _vindex = _mm256_mullo_epi32(_vindex, _mm256_set1_epi32(maxk));
#if __AVX512F__
        __m512i _vindex_512 = _mm512_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15);
        _vindex_512 = _mm512_mullo_epi32(_vindex_512, _mm512_set1_epi32(maxk));
#endif // __AVX512F__
#endif // __AVX2__

        int p = 0;
#if __AVX512F__
        for (; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;
                const float* k4 = kptr4 + k;
                const float* k5 = kptr5 + k;
                const float* k6 = kptr6 + k;
                const float* k7 = kptr7 + k;

                __m512 _k0 = _mm512_i32gather_ps(_vindex_512, k0, sizeof(float));
                __m512 _k1 = _mm512_i32gather_ps(_vindex_512, k1, sizeof(float));
                __m512 _k2 = _mm512_i32gather_ps(_vindex_512, k2, sizeof(float));
                __m512 _k3 = _mm512_i32gather_ps(_vindex_512, k3, sizeof(float));
                __m512 _k4 = _mm512_i32gather_ps(_vindex_512, k4, sizeof(float));
                __m512 _k5 = _mm512_i32gather_ps(_vindex_512, k5, sizeof(float));
                __m512 _k6 = _mm512_i32gather_ps(_vindex_512, k6, sizeof(float));
                __m512 _k7 = _mm512_i32gather_ps(_vindex_512, k7, sizeof(float));

                transpose16x8_ps(_k0, _k1, _k2, _k3, _k4, _k5, _k6, _k7);

                _mm512_storeu_ps(g00, _k0);
                _mm512_storeu_ps(g00 + 16, _k1);
                _mm512_storeu_ps(g00 + 16 * 2, _k2);
                _mm512_storeu_ps(g00 + 16 * 3, _k3);
                _mm512_storeu_ps(g00 + 16 * 4, _k4);
                _mm512_storeu_ps(g00 + 16 * 5, _k5);
                _mm512_storeu_ps(g00 + 16 * 6, _k6);
                _mm512_storeu_ps(g00 + 16 * 7, _k7);

                g00 += 128;
            }

            kptr0 += maxk * 16;
            kptr1 += maxk * 16;
            kptr2 += maxk * 16;
            kptr3 += maxk * 16;
            kptr4 += maxk * 16;
            kptr5 += maxk * 16;
            kptr6 += maxk * 16;
            kptr7 += maxk * 16;
        }
#endif // __AVX512F__
        for (; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;
                const float* k4 = kptr4 + k;
                const float* k5 = kptr5 + k;
                const float* k6 = kptr6 + k;
                const float* k7 = kptr7 + k;

#if __AVX2__
                __m256 _k0 = _mm256_i32gather_ps(k0, _vindex, sizeof(float));
                __m256 _k1 = _mm256_i32gather_ps(k1, _vindex, sizeof(float));
                __m256 _k2 = _mm256_i32gather_ps(k2, _vindex, sizeof(float));
                __m256 _k3 = _mm256_i32gather_ps(k3, _vindex, sizeof(float));
                __m256 _k4 = _mm256_i32gather_ps(k4, _vindex, sizeof(float));
                __m256 _k5 = _mm256_i32gather_ps(k5, _vindex, sizeof(float));
                __m256 _k6 = _mm256_i32gather_ps(k6, _vindex, sizeof(float));
                __m256 _k7 = _mm256_i32gather_ps(k7, _vindex, sizeof(float));

                transpose8x8_ps(_k0, _k1, _k2, _k3, _k4, _k5, _k6, _k7);

                _mm256_store_ps(g00, _k0);
                _mm256_store_ps(g00 + 8, _k1);
                _mm256_store_ps(g00 + 8 * 2, _k2);
                _mm256_store_ps(g00 + 8 * 3, _k3);
                _mm256_store_ps(g00 + 8 * 4, _k4);
                _mm256_store_ps(g00 + 8 * 5, _k5);
                _mm256_store_ps(g00 + 8 * 6, _k6);
                _mm256_store_ps(g00 + 8 * 7, _k7);

                g00 += 64;
#else  // __AVX2__
                for (int i = 0; i < 8; i++)
                {
                    g00[0] = k0[0];
                    g00[1] = k1[0];
                    g00[2] = k2[0];
                    g00[3] = k3[0];
                    g00[4] = k4[0];
                    g00[5] = k5[0];
                    g00[6] = k6[0];
                    g00[7] = k7[0];
                    k0 += maxk;
                    k1 += maxk;
                    k2 += maxk;
                    k3 += maxk;
                    k4 += maxk;
                    k5 += maxk;
                    k6 += maxk;
                    k7 += maxk;
                    g00 += 8;
                }
#endif // __AVX2__
            }

            kptr0 += maxk * 8;
            kptr1 += maxk * 8;
            kptr2 += maxk * 8;
            kptr3 += maxk * 8;
            kptr4 += maxk * 8;
            kptr5 += maxk * 8;
            kptr6 += maxk * 8;
            kptr7 += maxk * 8;
        }

#if __AVX2__
        _vindex = _mm256_mullo_epi32(_vindex, _mm256_set1_epi32(inch));
#endif // __AVX2__

        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
#if !__AVX2__
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;
                const float* k4 = kptr4 + k;
                const float* k5 = kptr5 + k;
                const float* k6 = kptr6 + k;
                const float* k7 = kptr7 + k;
#endif // !__AVX2__

                for (int i = 0; i < 4; i++)
                {
#if __AVX2__
                    __m256 _k0 = _mm256_i32gather_ps(k0, _vindex, sizeof(float));
                    _mm256_store_ps(g00, _k0);
                    k0 += maxk;
                    g00 += 8;
#else  // __AVX2__
                    g00[0] = k0[0];
                    g00[1] = k1[0];
                    g00[2] = k2[0];
                    g00[3] = k3[0];
                    g00[4] = k4[0];
                    g00[5] = k5[0];
                    g00[6] = k6[0];
                    g00[7] = k7[0];
                    k0 += maxk;
                    k1 += maxk;
                    k2 += maxk;
                    k3 += maxk;
                    k4 += maxk;
                    k5 += maxk;
                    k6 += maxk;
                    k7 += maxk;
                    g00 += 8;
#endif // __AVX2__
                }
            }

            kptr0 += maxk * 4;
#if !__AVX2__
            kptr1 += maxk * 4;
            kptr2 += maxk * 4;
            kptr3 += maxk * 4;
            kptr4 += maxk * 4;
            kptr5 += maxk * 4;
            kptr6 += maxk * 4;
            kptr7 += maxk * 4;
#endif // !__AVX2__
        }
        for (; p + 1 < inch; p += 2)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
#if !__AVX2__
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;
                const float* k4 = kptr4 + k;
                const float* k5 = kptr5 + k;
                const float* k6 = kptr6 + k;
                const float* k7 = kptr7 + k;
#endif // !__AVX2__

                for (int i = 0; i < 2; i++)
                {
#if __AVX2__
                    __m256 _k0 = _mm256_i32gather_ps(k0, _vindex, sizeof(float));
                    _mm256_store_ps(g00, _k0);
                    k0 += maxk;
                    g00 += 8;
#else  // __AVX2__
                    g00[0] = k0[0];
                    g00[1] = k1[0];
                    g00[2] = k2[0];
                    g00[3] = k3[0];
                    g00[4] = k4[0];
                    g00[5] = k5[0];
                    g00[6] = k6[0];
                    g00[7] = k7[0];
                    k0 += maxk;
                    k1 += maxk;
                    k2 += maxk;
                    k3 += maxk;
                    k4 += maxk;
                    k5 += maxk;
                    k6 += maxk;
                    k7 += maxk;
                    g00 += 8;
#endif // __AVX2__
                }
            }

            kptr0 += maxk * 2;
#if !__AVX2__
            kptr1 += maxk * 2;
            kptr2 += maxk * 2;
            kptr3 += maxk * 2;
            kptr4 += maxk * 2;
            kptr5 += maxk * 2;
            kptr6 += maxk * 2;
            kptr7 += maxk * 2;
#endif // !__AVX2__
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
#if __AVX2__
                __m256 _k0 = _mm256_i32gather_ps(k0, _vindex, sizeof(float));
                _mm256_store_ps(g00, _k0);
                g00 += 8;
#else  // __AVX2__
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;
                const float* k4 = kptr4 + k;
                const float* k5 = kptr5 + k;
                const float* k6 = kptr6 + k;
                const float* k7 = kptr7 + k;

                g00[0] = k0[0];
                g00[1] = k1[0];
                g00[2] = k2[0];
                g00[3] = k3[0];
                g00[4] = k4[0];
                g00[5] = k5[0];
                g00[6] = k6[0];
                g00[7] = k7[0];
                g00 += 8;
#endif // __AVX2__
            }
        }
    }
#endif // __AVX__
    for (; q + 3 < outch; q += 4)
    {
        const float* kptr0 = (const float*)kernel + q * inch * maxk;
        const float* kptr1 = (const float*)kernel + (q + 1) * inch * maxk;
        const float* kptr2 = (const float*)kernel + (q + 2) * inch * maxk;
        const float* kptr3 = (const float*)kernel + (q + 3) * inch * maxk;

#if __AVX512F__
        float* g00 = kernel_tm.channel(q / 16 + (q % 16) / 8 + (q % 8) / 4);
#elif __AVX__
        float* g00 = kernel_tm.channel(q / 8 + (q % 8) / 4);
#else
        float* g00 = kernel_tm.channel(q / 4);
#endif

#if __AVX2__
        __m128i _vindex = _mm_setr_epi32(0, 1, 2, 3);
        _vindex = _mm_mullo_epi32(_vindex, _mm_set1_epi32(maxk));
        __m256i _vindex_256 = _mm256_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7);
        _vindex_256 = _mm256_mullo_epi32(_vindex_256, _mm256_set1_epi32(maxk));
#if __AVX512F__
        __m512i _vindex_512 = _mm512_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15);
        _vindex_512 = _mm512_mullo_epi32(_vindex_512, _mm512_set1_epi32(maxk));
#endif // __AVX512F__
#endif // __AVX2__

        int p = 0;
#if __AVX__
#if __AVX512F__
        for (; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;

                __m512 _k0 = _mm512_i32gather_ps(_vindex_512, k0, sizeof(float));
                __m512 _k1 = _mm512_i32gather_ps(_vindex_512, k1, sizeof(float));
                __m512 _k2 = _mm512_i32gather_ps(_vindex_512, k2, sizeof(float));
                __m512 _k3 = _mm512_i32gather_ps(_vindex_512, k3, sizeof(float));

                transpose16x4_ps(_k0, _k1, _k2, _k3);

                _mm512_storeu_ps(g00, _k0);
                _mm512_storeu_ps(g00 + 16, _k1);
                _mm512_storeu_ps(g00 + 16 * 2, _k2);
                _mm512_storeu_ps(g00 + 16 * 3, _k3);

                g00 += 64;
            }

            kptr0 += maxk * 16;
            kptr1 += maxk * 16;
            kptr2 += maxk * 16;
            kptr3 += maxk * 16;
        }
#endif // __AVX512F__
        for (; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;

#if __AVX2__
                __m256 _k0 = _mm256_i32gather_ps(k0, _vindex_256, sizeof(float));
                __m256 _k1 = _mm256_i32gather_ps(k1, _vindex_256, sizeof(float));
                __m256 _k2 = _mm256_i32gather_ps(k2, _vindex_256, sizeof(float));
                __m256 _k3 = _mm256_i32gather_ps(k3, _vindex_256, sizeof(float));

                transpose8x4_ps(_k0, _k1, _k2, _k3);

                _mm256_storeu_ps(g00, _k0);
                _mm256_storeu_ps(g00 + 8, _k1);
                _mm256_storeu_ps(g00 + 8 * 2, _k2);
                _mm256_storeu_ps(g00 + 8 * 3, _k3);

                g00 += 32;
#else  // __AVX2__
                for (int i = 0; i < 8; i++)
                {
                    g00[0] = k0[0];
                    g00[1] = k1[0];
                    g00[2] = k2[0];
                    g00[3] = k3[0];
                    k0 += maxk;
                    k1 += maxk;
                    k2 += maxk;
                    k3 += maxk;
                    g00 += 4;
                }
#endif // __AVX2__
            }

            kptr0 += maxk * 8;
            kptr1 += maxk * 8;
            kptr2 += maxk * 8;
            kptr3 += maxk * 8;
        }
#endif // __AVX__
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;

#if __AVX2__
                __m128 _k0 = _mm_i32gather_ps(k0, _vindex, sizeof(float));
                __m128 _k1 = _mm_i32gather_ps(k1, _vindex, sizeof(float));
                __m128 _k2 = _mm_i32gather_ps(k2, _vindex, sizeof(float));
                __m128 _k3 = _mm_i32gather_ps(k3, _vindex, sizeof(float));

                _MM_TRANSPOSE4_PS(_k0, _k1, _k2, _k3);

                _mm_store_ps(g00, _k0);
                _mm_store_ps(g00 + 4, _k1);
                _mm_store_ps(g00 + 4 * 2, _k2);
                _mm_store_ps(g00 + 4 * 3, _k3);

                g00 += 16;
#else  // __AVX2__
                for (int i = 0; i < 4; i++)
                {
                    g00[0] = k0[0];
                    g00[1] = k1[0];
                    g00[2] = k2[0];
                    g00[3] = k3[0];
                    k0 += maxk;
                    k1 += maxk;
                    k2 += maxk;
                    k3 += maxk;
                    g00 += 4;
                }
#endif // __AVX2__
            }

            kptr0 += maxk * 4;
            kptr1 += maxk * 4;
            kptr2 += maxk * 4;
            kptr3 += maxk * 4;
        }

#if __AVX2__
        _vindex = _mm_mullo_epi32(_vindex, _mm_set1_epi32(inch));
#endif // __AVX2__

        for (; p + 1 < inch; p += 2)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
#if !__AVX2__
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;
#endif // !__AVX2__

                for (int i = 0; i < 2; i++)
                {
#if __AVX2__
                    __m128 _k0 = _mm_i32gather_ps(k0, _vindex, sizeof(float));
                    _mm_store_ps(g00, _k0);
                    k0 += maxk;
                    g00 += 4;
#else  // __AVX2__
                    g00[0] = k0[0];
                    g00[1] = k1[0];
                    g00[2] = k2[0];
                    g00[3] = k3[0];
                    k0 += maxk;
                    k1 += maxk;
                    k2 += maxk;
                    k3 += maxk;
                    g00 += 4;
#endif // __AVX2__
                }
            }

            kptr0 += maxk * 2;
#if !__AVX2__
            kptr1 += maxk * 2;
            kptr2 += maxk * 2;
            kptr3 += maxk * 2;
#endif // !__AVX2__
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
#if __AVX2__
                __m128 _k0 = _mm_i32gather_ps(k0, _vindex, sizeof(float));
                _mm_store_ps(g00, _k0);
                g00 += 4;
#else  // __AVX2__
                const float* k1 = kptr1 + k;
                const float* k2 = kptr2 + k;
                const float* k3 = kptr3 + k;

                g00[0] = k0[0];
                g00[1] = k1[0];
                g00[2] = k2[0];
                g00[3] = k3[0];
                g00 += 4;
#endif // __AVX2__
            }
        }
    }
#endif // __SSE2__
    for (; q + 1 < outch; q += 2)
    {
        const float* kptr0 = (const float*)kernel + q * inch * maxk;
        const float* kptr1 = (const float*)kernel + (q + 1) * inch * maxk;

#if __AVX512F__
        float* g00 = kernel_tm.channel(q / 16 + (q % 16) / 8 + (q % 8) / 4 + (q % 4) / 2);
#elif __AVX__
        float* g00 = kernel_tm.channel(q / 8 + (q % 8) / 4 + (q % 4) / 2);
#elif __SSE2__
        float* g00 = kernel_tm.channel(q / 4 + (q % 4) / 2);
#else
        float* g00 = kernel_tm.channel(q / 2);
#endif

#if __AVX2__
        __m128i _vindex = _mm_setr_epi32(0, 1, 2, 3);
        _vindex = _mm_mullo_epi32(_vindex, _mm_set1_epi32(maxk));
        __m256i _vindex_256 = _mm256_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7);
        _vindex_256 = _mm256_mullo_epi32(_vindex_256, _mm256_set1_epi32(maxk));
#if __AVX512F__
        __m512i _vindex_512 = _mm512_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15);
        _vindex_512 = _mm512_mullo_epi32(_vindex_512, _mm512_set1_epi32(maxk));
#endif // __AVX512F__
#endif // __AVX2__

        int p = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;

                __m512 _k0 = _mm512_i32gather_ps(_vindex_512, k0, sizeof(float));
                __m512 _k1 = _mm512_i32gather_ps(_vindex_512, k1, sizeof(float));
                _mm512_storeu_ps(g00, _k0);
                _mm512_storeu_ps(g00 + 16, _k1);
                g00 += 32;
            }

            kptr0 += maxk * 16;
            kptr1 += maxk * 16;
        }
#endif // __AVX512F__
        for (; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;

#if __AVX2__
                __m256 _k0 = _mm256_i32gather_ps(k0, _vindex_256, sizeof(float));
                __m256 _k1 = _mm256_i32gather_ps(k1, _vindex_256, sizeof(float));
                _mm256_storeu_ps(g00, _k0);
                _mm256_storeu_ps(g00 + 8, _k1);
                g00 += 16;
#else  // __AVX2__
                g00[0] = k0[0];
                g00[1] = k0[maxk];
                g00[2] = k0[maxk * 2];
                g00[3] = k0[maxk * 3];
                g00[4] = k0[maxk * 4];
                g00[5] = k0[maxk * 5];
                g00[6] = k0[maxk * 6];
                g00[7] = k0[maxk * 7];
                g00[8] = k1[0];
                g00[9] = k1[maxk];
                g00[10] = k1[maxk * 2];
                g00[11] = k1[maxk * 3];
                g00[12] = k1[maxk * 4];
                g00[13] = k1[maxk * 5];
                g00[14] = k1[maxk * 6];
                g00[15] = k1[maxk * 7];
                g00 += 16;
#endif // __AVX2__
            }

            kptr0 += maxk * 8;
            kptr1 += maxk * 8;
        }
#endif // __AVX__
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;

#if __AVX2__
                __m128 _k0 = _mm_i32gather_ps(k0, _vindex, sizeof(float));
                __m128 _k1 = _mm_i32gather_ps(k1, _vindex, sizeof(float));
                _mm_storeu_ps(g00, _k0);
                _mm_storeu_ps(g00 + 4, _k1);
                g00 += 8;
#else  // __AVX2__
                g00[0] = k0[0];
                g00[1] = k0[maxk];
                g00[2] = k0[maxk * 2];
                g00[3] = k0[maxk * 3];
                g00[4] = k1[0];
                g00[5] = k1[maxk];
                g00[6] = k1[maxk * 2];
                g00[7] = k1[maxk * 3];
                g00 += 8;
#endif // __AVX2__
            }

            kptr0 += maxk * 4;
            kptr1 += maxk * 4;
        }
#endif // __SSE2__
        for (; p + 1 < inch; p += 2)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;

                for (int i = 0; i < 2; i++)
                {
                    g00[0] = k0[0];
                    g00[1] = k1[0];
                    k0 += maxk;
                    k1 += maxk;
                    g00 += 2;
                }
            }

            kptr0 += maxk * 2;
            kptr1 += maxk * 2;
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr0 + k;
                const float* k1 = kptr1 + k;

                g00[0] = k0[0];
                g00[1] = k1[0];
                g00 += 2;
            }
        }
    }
    for (; q < outch; q++)
    {
        const float* kptr = (const float*)kernel + q * inch * maxk;

#if __AVX512F__
        float* g00 = kernel_tm.channel(q / 16 + (q % 16) / 8 + (q % 8) / 4 + (q % 4) / 2 + q % 2);
#elif __AVX__
        float* g00 = kernel_tm.channel(q / 8 + (q % 8) / 4 + (q % 4) / 2 + q % 2);
#elif __SSE2__
        float* g00 = kernel_tm.channel(q / 4 + (q % 4) / 2 + q % 2);
#else
        float* g00 = kernel_tm.channel(q / 2 + q % 2);
#endif

#if __AVX2__
        __m128i _vindex = _mm_setr_epi32(0, 1, 2, 3);
        _vindex = _mm_mullo_epi32(_vindex, _mm_set1_epi32(maxk));
        __m256i _vindex_256 = _mm256_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7);
        _vindex_256 = _mm256_mullo_epi32(_vindex_256, _mm256_set1_epi32(maxk));
#if __AVX512F__
        __m512i _vindex_512 = _mm512_setr_epi32(0, 1, 2, 3, 4, 5, 6, 7, 8, 9, 10, 11, 12, 13, 14, 15);
        _vindex_512 = _mm512_mullo_epi32(_vindex_512, _mm512_set1_epi32(maxk));
#endif // __AVX512F__
#endif // __AVX2__

        int p = 0;
#if __SSE2__
#if __AVX__
#if __AVX512F__
        for (; p + 15 < inch; p += 16)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr + k;

                __m512 _k0 = _mm512_i32gather_ps(_vindex_512, k0, sizeof(float));
                _mm512_storeu_ps(g00, _k0);
                g00 += 16;
            }

            kptr += maxk * 16;
        }
#endif // __AVX512F__
        for (; p + 7 < inch; p += 8)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr + k;

#if __AVX2__
                __m256 _k0 = _mm256_i32gather_ps(k0, _vindex_256, sizeof(float));
                _mm256_storeu_ps(g00, _k0);
                g00 += 8;
#else  // __AVX2__
                for (int i = 0; i < 8; i++)
                {
                    g00[0] = k0[0];
                    k0 += maxk;
                    g00 += 1;
                }
#endif // __AVX2__
            }

            kptr += maxk * 8;
        }
#endif // __AVX__
        for (; p + 3 < inch; p += 4)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr + k;

#if __AVX2__
                __m128 _k0 = _mm_i32gather_ps(k0, _vindex, sizeof(float));
                _mm_storeu_ps(g00, _k0);
                g00 += 4;
#else  // __AVX2__
                for (int i = 0; i < 4; i++)
                {
                    g00[0] = k0[0];
                    k0 += maxk;
                    g00 += 1;
                }
#endif // __AVX2__
            }

            kptr += maxk * 4;
        }
#endif // __SSE2__
        for (; p + 1 < inch; p += 2)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr + k;

                for (int i = 0; i < 2; i++)
                {
                    g00[0] = k0[0];
                    k0 += maxk;
                    g00 += 1;
                }
            }

            kptr += maxk * 2;
        }
        for (; p < inch; p++)
        {
            for (int k = 0; k < maxk; k++)
            {
                const float* k0 = kptr + k;

                g00[0] = k0[0];
                g00++;
            }
        }
    }
}